

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

size_t absl::lts_20250127::str_format_internal::(anonymous_namespace)::
       PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                 (unsigned_long digits,Buffer *out)

{
  size_t sVar1;
  
  if (digits == 0) {
    sVar1 = 0;
  }
  else {
    for (; digits != 0; digits = digits / 10) {
      anon_unknown_0::Buffer::push_front(out,(byte)(digits % 10) | 0x30);
    }
    sVar1 = (long)out->end - (long)out->begin;
    anon_unknown_0::Buffer::push_front(out,*out->begin);
    out->begin[1] = '.';
  }
  return sVar1;
}

Assistant:

size_t PrintIntegralDigits(Int digits, Buffer* out) {
  size_t printed = 0;
  if (digits) {
    for (; digits; digits /= 10) out->push_front(digits % 10 + '0');
    printed = out->size();
    if (mode == FormatStyle::Precision) {
      out->push_front(*out->begin);
      out->begin[1] = '.';
    } else {
      out->push_back('.');
    }
  } else if (mode == FormatStyle::Fixed) {
    out->push_front('0');
    out->push_back('.');
    printed = 1;
  }
  return printed;
}